

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O3

void __thiscall ftxui::ScreenInteractive::Loop(ScreenInteractive *this,Component *component)

{
  Motion *pMVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ReceiverImpl<ftxui::Event> *pRVar4;
  _Elt_pointer pEVar5;
  _Elt_pointer pEVar6;
  element_type *peVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  _Any_data _Var13;
  bool bVar14;
  undefined8 *puVar15;
  id __dest;
  pointer __dest_00;
  ostream *poVar16;
  code *pcVar17;
  allocator_type *__a;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  *extraout_RDX;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  *extraout_RDX_00;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  *pvVar18;
  long lVar19;
  undefined1 __n_00 [8];
  int signal;
  ScreenInteractive *pSVar20;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l_00;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l_01;
  Event event;
  thread event_listener;
  __sighandler_t old_signal_handler;
  _Any_data __tmp;
  undefined1 local_1a8 [8];
  thread *ptStack_1a0;
  undefined1 local_198 [16];
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  ScreenInteractive *local_170;
  ScreenInteractive *local_160;
  undefined1 local_158 [8];
  thread local_150 [4];
  _Elt_pointer local_130;
  Component local_128;
  _Elt_pointer local_118;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_110;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_f8;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_e0;
  void *local_c8 [2];
  _Manager_type local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  ScreenInteractive *local_90;
  termios local_88;
  _Elt_pointer *__n;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  *parameters;
  
  pvVar18 = (vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
             *)local_1a8;
  parameters = (vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                *)local_1a8;
  ptStack_1a0 = (thread *)0x0;
  local_1a8 = (undefined1  [8])this;
  local_198._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:278:26)>
       ::_M_invoke;
  local_198._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:278:26)>
       ::_M_manager;
  local_150[3]._M_id._M_thread = (id)(id)component;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1a8);
  local_160 = this;
  if ((_Manager_type)local_198._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_198._0_8_)(local_1a8,local_1a8,3);
  }
  lVar19 = 0;
  do {
    local_150[0]._M_id._M_thread._0_4_ = *(int *)((long)&DAT_0015970c + lVar19);
    local_88._0_8_ = ::signal(*(int *)((long)&DAT_0015970c + lVar19),anon_unknown_0::OnExit);
    ptStack_1a0 = (thread *)&local_88;
    local_1a8 = (undefined1  [8])local_150;
    local_198._8_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:214:26)>
         ::_M_invoke;
    local_198._0_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:214:26)>
         ::_M_manager;
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
               (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1a8);
    if ((_Manager_type)local_198._0_8_ != (_Manager_type)0x0) {
      (*(code *)local_198._0_8_)(local_1a8,local_1a8,3);
    }
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0x18);
  tcgetattr(0,&local_88);
  ptStack_1a0 = (thread *)0x0;
  puVar15 = (undefined8 *)operator_new(0x3c);
  *puVar15 = local_88._0_8_;
  puVar15[1] = CONCAT44(local_88.c_lflag,local_88.c_cflag);
  puVar15[2] = CONCAT26(local_88.c_cc._5_2_,local_88._16_6_);
  puVar15[3] = local_88.c_cc._7_8_;
  puVar15[4] = local_88.c_cc._15_8_;
  puVar15[5] = CONCAT44(local_88.c_cc._27_4_,local_88.c_cc._23_4_);
  *(ulong *)((long)puVar15 + 0x2c) = CONCAT44(local_88._48_4_,local_88.c_cc._27_4_);
  *(undefined8 *)((long)puVar15 + 0x34) = local_88._52_8_;
  local_1a8 = (undefined1  [8])puVar15;
  local_198._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:319:26)>
       ::_M_invoke;
  local_198._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:319:26)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1a8);
  pSVar20 = local_160;
  if ((_Manager_type)local_198._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_198._0_8_)(local_1a8,local_1a8,3);
  }
  local_88.c_lflag = local_88.c_lflag & 0xfffffff5;
  local_88.c_cc[5] = '\0';
  local_88.c_cc[6] = '\0';
  tcsetattr(0,0,&local_88);
  uVar12 = (anonymous_namespace)::on_resize._16_8_;
  local_1a8 = (undefined1  [8])(anonymous_namespace)::on_resize._0_8_;
  ptStack_1a0 = (thread *)(anonymous_namespace)::on_resize._8_8_;
  (anonymous_namespace)::on_resize._0_8_ = pSVar20;
  (anonymous_namespace)::on_resize._8_8_ = 0;
  local_198._0_8_ = (anonymous_namespace)::on_resize._16_8_;
  (anonymous_namespace)::on_resize._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:332:15)>
       ::_M_manager;
  local_198._8_8_ = (anonymous_namespace)::on_resize._24_8_;
  pcVar17 = std::
            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:332:15)>
            ::_M_invoke;
  (anonymous_namespace)::on_resize._24_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:332:15)>
       ::_M_invoke;
  if (uVar12 != 0) {
    (*(code *)uVar12)(local_1a8,local_1a8,3);
  }
  local_130 = (_Elt_pointer)CONCAT44(local_130._4_4_,0x1c);
  local_150[0]._M_id._M_thread = (id)::signal(0x1c,anon_unknown_0::OnResize);
  ptStack_1a0 = local_150;
  local_1a8 = (undefined1  [8])&local_130;
  local_198._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:214:26)>
       ::_M_invoke;
  local_198._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:214:26)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1a8);
  if ((_Manager_type)local_198._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_198._0_8_)(local_1a8,local_1a8,3);
  }
  auVar8[0xf] = 0;
  auVar8._0_15_ = stack0xfffffffffffffe59;
  _local_1a8 = (_Any_data)(auVar8 << 8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1a8,1);
  std::ostream::flush();
  _local_1a8 = (_Any_data)0x0;
  local_198._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:339:28)>
       ::_M_invoke;
  local_198._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:339:28)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1a8);
  if ((_Manager_type)local_198._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_198._0_8_)(local_1a8,local_1a8,3);
  }
  if (pSVar20->use_alternative_screen_ == true) {
    local_1a8._0_4_ = 0x419;
    __l._M_len = 1;
    __l._M_array = (iterator)local_1a8;
    std::
    vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
    ::vector(&local_f8,__l,(allocator_type *)pcVar17);
    Loop::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_f8,pvVar18);
    if ((_Elt_pointer)
        local_f8.
        super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
        ._M_impl.super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
      operator_delete(local_f8.
                      super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.
                            super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.
                            super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  ptStack_1a0 = (thread *)0x0;
  local_1a8 = (undefined1  [8])pSVar20;
  local_198._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:362:7)>
       ::_M_invoke;
  local_198._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:362:7)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1a8);
  if ((_Manager_type)local_198._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_198._0_8_)(local_1a8,local_1a8,3);
  }
  __n = &local_130;
  local_130 = (_Elt_pointer)0x700000019;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)__n;
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector(&local_e0,__l_00,(allocator_type *)pcVar17);
  pcVar17 = (code *)((long)local_e0.
                           super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e0.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  __dest._M_thread =
       (native_handle_type)
       std::
       _Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
       ::_M_allocate((_Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                      *)((long)pcVar17 >> 2),(size_t)__n);
  local_150[1]._M_id._M_thread = (id)(pcVar17 + __dest._M_thread);
  pvVar18 = extraout_RDX;
  local_150[0]._M_id._M_thread = (id)(id)__dest._M_thread;
  local_150[2]._M_id._M_thread = local_150[1]._M_id._M_thread;
  if (local_e0.
      super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_e0.
      super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    memmove((void *)__dest._M_thread,
            local_e0.
            super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
            ._M_impl.super__Vector_impl_data._M_start,(size_t)pcVar17);
    pvVar18 = extraout_RDX_00;
  }
  (anonymous_namespace)::Reset_abi_cxx11_
            ((string *)local_1a8,(_anonymous_namespace_ *)local_150,pvVar18);
  __n_00 = local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_1a8,(long)ptStack_1a0);
  if (local_1a8 != (undefined1  [8])local_198) {
    __n_00 = (undefined1  [8])(local_198._0_8_ + 1);
    operator_delete((void *)local_1a8,(ulong)__n_00);
  }
  if ((pointer)__dest._M_thread != (pointer)0x0) {
    __n_00 = (undefined1  [8])pcVar17;
    operator_delete((void *)__dest._M_thread,(ulong)pcVar17);
  }
  __dest_00 = std::
              _Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
              ::_M_allocate((_Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                             *)((long)pcVar17 >> 2),(size_t)__n_00);
  if (local_e0.
      super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_e0.
      super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    memmove(__dest_00,
            local_e0.
            super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
            ._M_impl.super__Vector_impl_data._M_start,(size_t)pcVar17);
  }
  ptStack_1a0 = (thread *)0x0;
  puVar15 = (undefined8 *)operator_new(0x18);
  __a = (allocator_type *)((long)__dest_00 + (long)pcVar17);
  *puVar15 = __dest_00;
  puVar15[1] = __a;
  puVar15[2] = __a;
  local_1a8 = (undefined1  [8])puVar15;
  local_198._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:349:28)>
       ::_M_invoke;
  local_198._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:349:28)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1a8);
  pSVar20 = local_160;
  if ((_Manager_type)local_198._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_198._0_8_)(local_1a8,local_1a8,3);
  }
  if (local_e0.
      super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ptStack_1a0._0_4_ = 0x3ee;
  local_1a8 = (undefined1  [8])0x3ed000003eb;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_1a8;
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector(&local_110,__l_01,__a);
  Loop::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_110,parameters);
  if ((_Elt_pointer)
      local_110.
      super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
      ._M_impl.super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_110.
                    super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  auVar9[0xf] = 0;
  auVar9._0_15_ = stack0xfffffffffffffe59;
  _local_1a8 = (_Any_data)(auVar9 << 8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1a8,1);
  std::ostream::flush();
  _local_1a8 = (_Any_data)0x0;
  local_198._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:339:28)>
       ::_M_invoke;
  local_198._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O3/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:339:28)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1a8);
  if ((_Manager_type)local_198._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_198._0_8_)(local_1a8,local_1a8,3);
  }
  local_1a8 = (undefined1  [8])anon_unknown_0::EventListener;
  local_130 = (_Elt_pointer)&pSVar20->quit_;
  local_118 = local_130;
  ReceiverImpl<ftxui::Event>::MakeSender((ReceiverImpl<ftxui::Event> *)local_158);
  std::thread::
  thread<void(*)(std::atomic<bool>*,std::unique_ptr<ftxui::SenderImpl<ftxui::Event>,std::default_delete<ftxui::SenderImpl<ftxui::Event>>>),std::atomic<bool>*,std::unique_ptr<ftxui::SenderImpl<ftxui::Event>,std::default_delete<ftxui::SenderImpl<ftxui::Event>>>,void>
            (local_150,
             (_func_void_atomic<bool>_ptr_unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
              **)local_1a8,(atomic<bool> **)&local_130,
             (unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
              *)local_158);
  if (local_158 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)(*(long *)local_158 + 0xa8) = *(int *)(*(long *)local_158 + 0xa8) + -1;
    UNLOCK();
    std::condition_variable::notify_one();
    operator_delete((void *)local_158,8);
  }
  pSVar20 = local_160;
  do {
    if ((((__atomic_base<bool> *)&local_118->type_)->_M_i & 1U) != 0) break;
    pRVar4 = (pSVar20->event_receiver_)._M_t.
             super___uniq_ptr_impl<ftxui::ReceiverImpl<ftxui::Event>,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
             .super__Head_base<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_false>._M_head_impl;
    ptStack_1a0._0_1_ = 0;
    local_1a8 = (undefined1  [8])pRVar4;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1a8);
    ptStack_1a0._0_1_ = 1;
    pEVar5 = (pRVar4->queue_).c.super__Deque_base<ftxui::Event,_std::allocator<ftxui::Event>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    pEVar6 = (pRVar4->queue_).c.super__Deque_base<ftxui::Event,_std::allocator<ftxui::Event>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1a8);
    if (pEVar5 == pEVar6) {
      local_128.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
           local_150[3]._M_id._M_thread)->_M_ptr;
      local_128.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)local_150[3]._M_id._M_thread + 8))->_M_pi;
      if ((_Elt_pointer)
          local_128.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Elt_pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pMVar1 = &(((_Elt_pointer)
                     local_128.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->field_1).mouse_.motion;
          *pMVar1 = *pMVar1 + Pressed;
          UNLOCK();
        }
        else {
          pMVar1 = &(((_Elt_pointer)
                     local_128.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->field_1).mouse_.motion;
          *pMVar1 = *pMVar1 + Pressed;
        }
      }
      Draw(pSVar20,&local_128);
      if ((_Elt_pointer)
          local_128.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Elt_pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      Screen::ToString_abi_cxx11_((string *)local_1a8,&pSVar20->super_Screen);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_1a8,(long)ptStack_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,(pSVar20->set_cursor_position)._M_dataplus._M_p,
                 (pSVar20->set_cursor_position)._M_string_length);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,(ulong)(local_198._0_8_ + 1));
      }
      auVar10[0xf] = 0;
      auVar10._0_15_ = stack0xfffffffffffffe59;
      _local_1a8 = (_Any_data)(auVar10 << 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1a8,1);
      std::ostream::flush();
      Screen::Clear(&pSVar20->super_Screen);
    }
    auVar11._12_4_ = 0;
    auVar11._0_12_ = stack0xfffffffffffffe5c;
    _local_1a8 = (_Any_data)(auVar11 << 0x20);
    local_188 = 0;
    local_180._M_local_buf[0] = '\0';
    local_170 = (ScreenInteractive *)0x0;
    local_198._8_8_ = &local_180;
    bVar14 = ReceiverImpl<ftxui::Event>::Receive
                       ((pSVar20->event_receiver_)._M_t.
                        super___uniq_ptr_impl<ftxui::ReceiverImpl<ftxui::Event>,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
                        .super__Head_base<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_false>.
                        _M_head_impl,(Event *)local_1a8);
    _Var13 = _local_1a8;
    pSVar20 = local_160;
    _local_1a8 = _Var13;
    if (bVar14) {
      if (local_1a8._0_4_ == 2) {
        uVar2 = local_160->cursor_x_;
        uVar3 = local_160->cursor_y_;
        local_198._0_8_ = CONCAT44(SUB84(local_198._0_8_,4) - uVar3,(int)local_198._0_8_ - uVar2);
      }
      else if (local_1a8._0_4_ == 3) {
        local_160->cursor_x_ = local_1a8._4_4_;
        local_160->cursor_y_ = ptStack_1a0._0_4_;
        goto LAB_001449e4;
      }
      local_170 = local_160;
      peVar7 = ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
               local_150[3]._M_id._M_thread)->_M_ptr;
      local_b8 = (_Manager_type)local_198._0_8_;
      local_c8[0] = (void *)local_1a8;
      local_c8[1] = ptStack_1a0;
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,local_198._8_8_,local_188 + local_198._8_8_);
      local_90 = local_170;
      (*peVar7->_vptr_ComponentBase[3])(peVar7,local_c8);
      pSVar20 = local_160;
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
    }
LAB_001449e4:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._8_8_ != &local_180) {
      operator_delete((void *)local_198._8_8_,
                      CONCAT71(local_180._M_allocated_capacity._1_7_,local_180._M_local_buf[0]) + 1)
      ;
    }
  } while (bVar14);
  signal = (int)local_150;
  std::thread::join();
  anon_unknown_0::OnExit(signal);
  if (local_150[0]._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

void ScreenInteractive::Loop(Component component) {
  on_exit_functions.push([this] { ExitLoopClosure()(); });

  // Install signal handlers to restore the terminal state on exit. The default
  // signal handlers are restored on exit.
  for (int signal : {SIGTERM, SIGSEGV, SIGINT, SIGILL, SIGABRT, SIGFPE})
    install_signal_handler(signal, OnExit);

    // Save the old terminal configuration and restore it on exit.
#if defined(_WIN32)
  // Enable VT processing on stdout and stdin
  auto stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);
  auto stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  DWORD out_mode = 0;
  DWORD in_mode = 0;
  GetConsoleMode(stdout_handle, &out_mode);
  GetConsoleMode(stdin_handle, &in_mode);
  on_exit_functions.push([=] { SetConsoleMode(stdout_handle, out_mode); });
  on_exit_functions.push([=] { SetConsoleMode(stdin_handle, in_mode); });

  // https://docs.microsoft.com/en-us/windows/console/setconsolemode
  const int enable_virtual_terminal_processing = 0x0004;
  const int disable_newline_auto_return = 0x0008;
  out_mode |= enable_virtual_terminal_processing;
  out_mode |= disable_newline_auto_return;

  // https://docs.microsoft.com/en-us/windows/console/setconsolemode
  const int enable_line_input = 0x0002;
  const int enable_echo_input = 0x0004;
  const int enable_virtual_terminal_input = 0x0200;
  const int enable_window_input = 0x0008;
  in_mode &= ~enable_echo_input;
  in_mode &= ~enable_line_input;
  in_mode |= enable_virtual_terminal_input;
  in_mode |= enable_window_input;

  SetConsoleMode(stdin_handle, in_mode);
  SetConsoleMode(stdout_handle, out_mode);
#else
  struct termios terminal;
  tcgetattr(STDIN_FILENO, &terminal);
  on_exit_functions.push([=] { tcsetattr(STDIN_FILENO, TCSANOW, &terminal); });

  terminal.c_lflag &= ~ICANON;  // Non canonique terminal.
  terminal.c_lflag &= ~ECHO;    // Do not print after a key press.
  terminal.c_cc[VMIN] = 0;
  terminal.c_cc[VTIME] = 0;
  // auto oldf = fcntl(STDIN_FILENO, F_GETFL, 0);
  // fcntl(STDIN_FILENO, F_SETFL, oldf | O_NONBLOCK);
  // on_exit_functions.push([=] { fcntl(STDIN_FILENO, F_GETFL, oldf); });

  tcsetattr(STDIN_FILENO, TCSANOW, &terminal);

  // Handle resize.
  on_resize = [&] { event_sender_->Send(Event::Special({0})); };
  install_signal_handler(SIGWINCH, OnResize);
#endif

  // Commit state:
  auto flush = [&] {
    Flush();
    on_exit_functions.push([] { Flush(); });
  };

  auto enable = [&](std::vector<DECMode> parameters) {
    std::cout << Set(parameters);
    on_exit_functions.push([=] { std::cout << Reset(parameters); });
  };

  auto disable = [&](std::vector<DECMode> parameters) {
    std::cout << Reset(parameters);
    on_exit_functions.push([=] { std::cout << Set(parameters); });
  };

  flush();

  if (use_alternative_screen_) {
    enable({
        DECMode::kAlternateScreen,
    });
  }

  // On exit, reset cursor one line after the current drawing.
  on_exit_functions.push(
      [this] { std::cout << reset_cursor_position << std::endl; });

  disable({
      DECMode::kCursor,
      DECMode::kLineWrap,
  });

  enable({
      // DECMode::kMouseVt200,
      DECMode::kMouseAnyEvent,
      DECMode::kMouseUtf8,
      DECMode::kMouseSgrExtMode,
  });

  flush();

  auto event_listener =
      std::thread(&EventListener, &quit_, event_receiver_->MakeSender());

  // The main loop.
  while (!quit_) {
    if (!event_receiver_->HasPending()) {
      Draw(component);
      std::cout << ToString() << set_cursor_position;
      Flush();
      Clear();
    }

    Event event;
    if (!event_receiver_->Receive(&event))
      break;

    if (event.is_cursor_reporting()) {
      cursor_x_ = event.cursor_x();
      cursor_y_ = event.cursor_y();
      continue;
    }

    if (event.is_mouse()) {
      event.mouse().x -= cursor_x_;
      event.mouse().y -= cursor_y_;
    }

    event.screen_ = this;
    component->OnEvent(event);
  }

  event_listener.join();
  OnExit(0);
}